

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mtwister.c
# Opt level: O3

unsigned_long genRandLong(MTRand *rand)

{
  int iVar1;
  ulong uVar2;
  uint uVar3;
  long lVar5;
  unsigned_long uVar4;
  
  uVar3 = rand->index;
  if ((ulong)uVar3 < 0x270) {
    uVar2 = rand->mt[uVar3];
    iVar1 = uVar3 + 1;
  }
  else {
    if (uVar3 == 0x270) {
      uVar4 = rand->mt[0];
    }
    else {
      rand->mt[0] = 0x1105;
      lVar5 = 1;
      uVar4 = 0;
      uVar2 = 0x1105;
      do {
        uVar2 = (ulong)(uint)((int)uVar2 * 0x17b5);
        rand->mt[lVar5] = uVar2;
        lVar5 = lVar5 + 1;
      } while (lVar5 != 0x270);
    }
    lVar5 = 0;
    do {
      uVar3 = (uint)uVar4;
      uVar4 = rand->mt[lVar5 + 1];
      rand->mt[lVar5] =
           genRandLong::mag[(uint)uVar4 & 1] ^ rand->mt[lVar5 + 0x18d] ^
           (ulong)(((uint)uVar4 & 0x7ffffffe | uVar3 & 0x80000000) >> 1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0xe3);
    uVar4 = rand->mt[0xe3];
    lVar5 = 0xe4;
    do {
      uVar3 = (uint)uVar4;
      uVar4 = rand->mt[lVar5];
      rand->mt[lVar5 + -1] =
           genRandLong::mag[(uint)uVar4 & 1] ^ *(ulong *)((long)rand + lVar5 * 8 + -0x720) ^
           (ulong)(((uint)uVar4 & 0x7ffffffe | uVar3 & 0x80000000) >> 1);
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x270);
    uVar2 = rand->mt[0];
    rand->mt[0x26f] =
         genRandLong::mag[(uint)uVar2 & 1] ^ rand->mt[0x18c] ^
         (ulong)(((uint)uVar2 & 0x7ffffffe | (uint)rand->mt[0x26f] & 0x80000000) >> 1);
    iVar1 = 1;
  }
  rand->index = iVar1;
  uVar2 = uVar2 >> 0xb ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x13a58ad) << 7 ^ uVar2;
  uVar2 = ((uint)uVar2 & 0x1df8c) << 0xf ^ uVar2;
  return uVar2 >> 0x12 ^ uVar2;
}

Assistant:

unsigned long genRandLong(MTRand* rand) {

  unsigned long y;
  static unsigned long mag[2] = {0x0, 0x9908b0df}; /* mag[x] = x * 0x9908b0df for x = 0,1 */
  if(rand->index >= STATE_VECTOR_LENGTH || rand->index < 0) {
    /* generate STATE_VECTOR_LENGTH words at a time */
    int kk;
    if(rand->index >= STATE_VECTOR_LENGTH+1 || rand->index < 0) {
      m_seedRand(rand, 4357);
    }
    for(kk=0; kk<STATE_VECTOR_LENGTH-STATE_VECTOR_M; kk++) {
      y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk+1] & LOWER_MASK);
      rand->mt[kk] = rand->mt[kk+STATE_VECTOR_M] ^ (y >> 1) ^ mag[y & 0x1];
    }
    for(; kk<STATE_VECTOR_LENGTH-1; kk++) {
      y = (rand->mt[kk] & UPPER_MASK) | (rand->mt[kk+1] & LOWER_MASK);
      rand->mt[kk] = rand->mt[kk+(STATE_VECTOR_M-STATE_VECTOR_LENGTH)] ^ (y >> 1) ^ mag[y & 0x1];
    }
    y = (rand->mt[STATE_VECTOR_LENGTH-1] & UPPER_MASK) | (rand->mt[0] & LOWER_MASK);
    rand->mt[STATE_VECTOR_LENGTH-1] = rand->mt[STATE_VECTOR_M-1] ^ (y >> 1) ^ mag[y & 0x1];
    rand->index = 0;
  }
  y = rand->mt[rand->index++];
  y ^= (y >> 11);
  y ^= (y << 7) & TEMPERING_MASK_B;
  y ^= (y << 15) & TEMPERING_MASK_C;
  y ^= (y >> 18);
  return y;
}